

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructAddHandler_Test::~Engine_testConstructAddHandler_Test
          (Engine_testConstructAddHandler_Test *this)

{
  void *in_RDI;
  
  ~Engine_testConstructAddHandler_Test((Engine_testConstructAddHandler_Test *)0x1300e8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testConstructAddHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    e.RegisterHandler(std::move(std::make_unique<PrintHandler>()));
    ASSERT_EQ(1, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get()));
}